

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O1

Node<KalahaState<(short)6>_> * __thiscall
MCTS::Node<KalahaState<(short)6>_>::add_child
          (Node<KalahaState<(short)6>_> *this,Move *move,KalahaState<(short)6> *state)

{
  pointer *pppNVar1;
  short sVar2;
  iterator __position;
  short *psVar3;
  pointer psVar4;
  Node<KalahaState<(short)6>_> *pNVar5;
  short *psVar6;
  bool bVar7;
  Node<KalahaState<(short)6>_> *node;
  Node<KalahaState<(short)6>_> *local_28;
  
  pNVar5 = (Node<KalahaState<(short)6>_> *)operator_new(0x60);
  pNVar5->move = *move;
  pNVar5->parent = this;
  pNVar5->player_to_move = state->player_to_move;
  pNVar5->wins = 0.0;
  pNVar5->visits = 0;
  KalahaState<(short)6>::get_moves(&pNVar5->moves,state);
  (pNVar5->children).
  super__Vector_base<MCTS::Node<KalahaState<(short)6>_>_*,_std::allocator<MCTS::Node<KalahaState<(short)6>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pNVar5->UCT_score = 0.0;
  (pNVar5->children).
  super__Vector_base<MCTS::Node<KalahaState<(short)6>_>_*,_std::allocator<MCTS::Node<KalahaState<(short)6>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pNVar5->children).
  super__Vector_base<MCTS::Node<KalahaState<(short)6>_>_*,_std::allocator<MCTS::Node<KalahaState<(short)6>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __position._M_current =
       (this->children).
       super__Vector_base<MCTS::Node<KalahaState<(short)6>_>_*,_std::allocator<MCTS::Node<KalahaState<(short)6>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_28 = pNVar5;
  if (__position._M_current ==
      (this->children).
      super__Vector_base<MCTS::Node<KalahaState<(short)6>_>_*,_std::allocator<MCTS::Node<KalahaState<(short)6>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<MCTS::Node<KalahaState<(short)6>>*,std::allocator<MCTS::Node<KalahaState<(short)6>>*>>::
    _M_realloc_insert<MCTS::Node<KalahaState<(short)6>>*const&>
              ((vector<MCTS::Node<KalahaState<(short)6>>*,std::allocator<MCTS::Node<KalahaState<(short)6>>*>>
                *)&this->children,__position,&local_28);
  }
  else {
    *__position._M_current = pNVar5;
    pppNVar1 = &(this->children).
                super__Vector_base<MCTS::Node<KalahaState<(short)6>_>_*,_std::allocator<MCTS::Node<KalahaState<(short)6>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  if ((this->children).
      super__Vector_base<MCTS::Node<KalahaState<(short)6>_>_*,_std::allocator<MCTS::Node<KalahaState<(short)6>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->children).
      super__Vector_base<MCTS::Node<KalahaState<(short)6>_>_*,_std::allocator<MCTS::Node<KalahaState<(short)6>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    assertion_failed("! children.empty()",
                     "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/mcts.h"
                     ,0xf2);
  }
  psVar6 = (this->moves).super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  psVar3 = (this->moves).super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar7 = psVar6 == psVar3;
  if (!bVar7) {
    sVar2 = *psVar6;
    while (sVar2 != *move) {
      psVar6 = psVar6 + 1;
      bVar7 = psVar6 == psVar3;
      if (bVar7) goto LAB_0010d363;
      sVar2 = *psVar6;
    }
    if (!bVar7) {
      psVar4 = (this->moves).super__Vector_base<short,_std::allocator<short>_>._M_impl.
               super__Vector_impl_data._M_finish;
      sVar2 = *psVar6;
      *psVar6 = psVar4[-1];
      psVar4[-1] = sVar2;
      std::vector<short,_std::allocator<short>_>::resize
                (&this->moves,
                 ((long)psVar4 -
                  (long)(this->moves).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                        super__Vector_impl_data._M_start >> 1) - 1);
      return local_28;
    }
  }
LAB_0010d363:
  assertion_failed("itr != moves.end()",
                   "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/mcts.h"
                   ,0xf6);
}

Assistant:

Node<State>* Node<State>::add_child(const Move& move, const State& state)
{
	auto node = new Node(state, move, this);
	children.push_back(node);
	attest( ! children.empty());

	auto itr = moves.begin();
	for (; itr != moves.end() && *itr != move; ++itr);
	attest(itr != moves.end());
	std::iter_swap(itr, moves.end() - 1);
	moves.resize(moves.size() - 1);
	return node;
}